

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall QtPromisePrivate::PromiseData<int>::resolve<int>(PromiseData<int> *this,int *value)

{
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<int,int>((int *)&local_20);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&this->m_value,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  PromiseDataBase<int,_void_(const_int_&)>::setSettled
            (&this->super_PromiseDataBase<int,_void_(const_int_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }